

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cpp
# Opt level: O0

int anon_unknown.dwarf_7e45::ZeroCrossingEngine
              (double *filtered_signal,int y_length,double fs,double *interval_locations,
              double *intervals)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  int local_6c;
  int local_68;
  int local_64;
  int i_3;
  int i_2;
  double *fine_edges;
  int i_1;
  int count;
  int *edges;
  int i;
  int *negative_going_points;
  double *intervals_local;
  double *interval_locations_local;
  double fs_local;
  int y_length_local;
  double *filtered_signal_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)y_length;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  for (edges._4_4_ = 0; edges._4_4_ < y_length + -1; edges._4_4_ = edges._4_4_ + 1) {
    if ((filtered_signal[edges._4_4_] <= 0.0) || (0.0 < filtered_signal[edges._4_4_ + 1])) {
      local_6c = 0;
    }
    else {
      local_6c = edges._4_4_ + 1;
    }
    *(int *)((long)pvVar5 + (long)edges._4_4_ * 4) = local_6c;
  }
  *(undefined4 *)((long)pvVar5 + (long)(y_length + -1) * 4) = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)y_length;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar4);
  fine_edges._4_4_ = 0;
  for (fine_edges._0_4_ = 0; (int)fine_edges < y_length; fine_edges._0_4_ = (int)fine_edges + 1) {
    if (0 < *(int *)((long)pvVar5 + (long)(int)fine_edges * 4)) {
      *(undefined4 *)((long)pvVar6 + (long)fine_edges._4_4_ * 4) =
           *(undefined4 *)((long)pvVar5 + (long)(int)fine_edges * 4);
      fine_edges._4_4_ = fine_edges._4_4_ + 1;
    }
  }
  if (fine_edges._4_4_ < 2) {
    if (pvVar6 != (void *)0x0) {
      operator_delete__(pvVar6);
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
    filtered_signal_local._4_4_ = 0;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)fine_edges._4_4_;
    uVar4 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar7 = operator_new__(uVar4);
    for (local_64 = 0; local_64 < fine_edges._4_4_; local_64 = local_64 + 1) {
      *(double *)((long)pvVar7 + (long)local_64 * 8) =
           (double)*(int *)((long)pvVar6 + (long)local_64 * 4) -
           filtered_signal[*(int *)((long)pvVar6 + (long)local_64 * 4) + -1] /
           (filtered_signal[*(int *)((long)pvVar6 + (long)local_64 * 4)] -
           filtered_signal[*(int *)((long)pvVar6 + (long)local_64 * 4) + -1]);
    }
    for (local_68 = 0; local_68 < fine_edges._4_4_ + -1; local_68 = local_68 + 1) {
      intervals[local_68] =
           fs / (*(double *)((long)pvVar7 + (long)(local_68 + 1) * 8) -
                *(double *)((long)pvVar7 + (long)local_68 * 8));
      interval_locations[local_68] =
           ((*(double *)((long)pvVar7 + (long)local_68 * 8) +
            *(double *)((long)pvVar7 + (long)(local_68 + 1) * 8)) / 2.0) / fs;
    }
    if (pvVar7 != (void *)0x0) {
      operator_delete__(pvVar7);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete__(pvVar6);
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
    filtered_signal_local._4_4_ = fine_edges._4_4_ + -1;
  }
  return filtered_signal_local._4_4_;
}

Assistant:

static int ZeroCrossingEngine(const double *filtered_signal, int y_length,
    double fs, double *interval_locations, double *intervals) {
  int *negative_going_points = new int[y_length];

  for (int i = 0; i < y_length - 1; ++i)
    negative_going_points[i] =
      0.0 < filtered_signal[i] && filtered_signal[i + 1] <= 0.0 ? i + 1 : 0;
  negative_going_points[y_length - 1] = 0;

  int *edges = new int[y_length];
  int count = 0;
  for (int i = 0; i < y_length; ++i)
    if (negative_going_points[i] > 0)
      edges[count++] = negative_going_points[i];

  if (count < 2) {
    delete[] edges;
    delete[] negative_going_points;
    return 0;
  }

  double *fine_edges = new double[count];
  for (int i = 0; i < count; ++i)
    fine_edges[i] =
      edges[i] - filtered_signal[edges[i] - 1] /
      (filtered_signal[edges[i]] - filtered_signal[edges[i] - 1]);

  for (int i = 0; i < count - 1; ++i) {
    intervals[i] = fs / (fine_edges[i + 1] - fine_edges[i]);
    interval_locations[i] = (fine_edges[i] + fine_edges[i + 1]) / 2.0 / fs;
  }

  delete[] fine_edges;
  delete[] edges;
  delete[] negative_going_points;
  return count - 1;
}